

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O0

CDAG * degreeOrdered(CDAG *__return_storage_ptr__,CGraph *g)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  EdgeIdx *pEVar8;
  VertexIdx *pVVar9;
  DegreeComp local_98;
  long local_90;
  VertexIdx i_1;
  EdgeIdx j;
  VertexIdx i;
  VertexIdx degdest;
  VertexIdx degi;
  VertexIdx dest;
  EdgeIdx incur;
  EdgeIdx outcur;
  CGraph indag;
  CGraph outdag;
  CGraph *g_local;
  
  indag.nbors = (VertexIdx *)g->nVertices;
  outdag.nVertices = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = g->nVertices + 1;
  uVar7 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pEVar8 = (EdgeIdx *)operator_new__(uVar7);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = g->nEdges + 1;
  uVar7 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pVVar9 = (VertexIdx *)operator_new__(uVar7);
  outcur = g->nVertices;
  indag.nVertices = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = g->nVertices + 1;
  uVar7 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  indag.nEdges = (EdgeIdx)operator_new__(uVar7);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = g->nEdges + 1;
  uVar7 = SUB168(auVar6 * ZEXT816(8),0);
  if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  indag.offsets = (EdgeIdx *)operator_new__(uVar7);
  incur = 0;
  dest = 0;
  *pEVar8 = 0;
  *(undefined8 *)indag.nEdges = 0;
  for (j = 0; j < g->nVertices; j = j + 1) {
    for (i_1 = g->offsets[j]; i_1 < g->offsets[j + 1]; i_1 = i_1 + 1) {
      degi = g->nbors[i_1];
      degdest = g->offsets[j + 1] - g->offsets[j];
      i = g->offsets[degi + 1] - g->offsets[degi];
      if ((degdest < i) || ((degdest == i && (j < degi)))) {
        pVVar9[incur] = degi;
        incur = incur + 1;
        outdag.nVertices = outdag.nVertices + 1;
      }
      else {
        indag.offsets[dest] = degi;
        dest = dest + 1;
        indag.nVertices = indag.nVertices + 1;
      }
    }
    pEVar8[j + 1] = incur;
    *(VertexIdx *)(indag.nEdges + 8 + j * 8) = dest;
  }
  for (local_90 = 0; local_90 < g->nVertices; local_90 = local_90 + 1) {
    lVar1 = pEVar8[local_90];
    lVar2 = pEVar8[local_90 + 1];
    DegreeComp::DegreeComp(&local_98,g);
    std::sort<long*,DegreeComp>(pVVar9 + lVar1,pVVar9 + lVar2,local_98);
  }
  (__return_storage_ptr__->outlist).nVertices = (VertexIdx)indag.nbors;
  (__return_storage_ptr__->outlist).nEdges = outdag.nVertices;
  (__return_storage_ptr__->outlist).offsets = pEVar8;
  (__return_storage_ptr__->outlist).nbors = pVVar9;
  (__return_storage_ptr__->inlist).nVertices = outcur;
  (__return_storage_ptr__->inlist).nEdges = indag.nVertices;
  (__return_storage_ptr__->inlist).offsets = (EdgeIdx *)indag.nEdges;
  (__return_storage_ptr__->inlist).nbors = indag.offsets;
  return __return_storage_ptr__;
}

Assistant:

CDAG degreeOrdered(CGraph *g) {
    CDAG ret;     // CDAG to be returned
    CGraph outdag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                     new VertexIdx[g->nEdges + 1]};  // Initialize DAG of out-edges
    CGraph indag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                    new VertexIdx[g->nEdges + 1]};   // Initialize DAG of in-edges
    EdgeIdx outcur = 0;
    EdgeIdx incur = 0;
    VertexIdx dest;
    VertexIdx degi;
    VertexIdx degdest;

    outdag.offsets[0] = 0;
    indag.offsets[0] = 0;
    for (VertexIdx i = 0; i < g->nVertices; ++i)   // Looping over all vertices in g
    {
        for (EdgeIdx j = g->offsets[i]; j < g->offsets[i + 1]; ++j)   // Looping over neighbors of i in g
        {
            dest = g->nbors[j];     // We are now looking at edge (i,dest)
            degi = g->offsets[i + 1] - g->offsets[i];   // Degree of i
            degdest = g->offsets[dest + 1] - g->offsets[dest];   // Degree of dest
            //printf("i=%lld dest=%lld degi=%lld degdest=%lld\n",i,dest,degi,degdest);

            //We now orient the edge depending of degi vs degdest.
            // We break ties according to vertex id.
            // In the output, the g-edge (i,dest) is either pointing to dest (in if condition) or pointing to i (in else condition).

            if (degi < degdest || (degi == degdest && i < dest)) {
                outdag.nbors[outcur] = dest;   // We want point edge from i to dest. So this directed edge is added to outdag.
                ++outcur;                      // Increment pointer in outdag.nbors and the number of edges in outdag.
                ++outdag.nEdges;
            } else {
                indag.nbors[incur] = dest;     // We point edge from dest to i. So this edge goes into indag.
                ++incur;                       // Pointer and number of edges incremented
                ++indag.nEdges;
            }
        }
        outdag.offsets[i +
                       1] = outcur;         // We have finished all edges incident to i, so we can update offsets in DAGs.
        indag.offsets[i + 1] = incur;
    }

    for (VertexIdx i = 0; i < g->nVertices; ++i)  // Loops over vertices
        std::sort(outdag.nbors + outdag.offsets[i], outdag.nbors + outdag.offsets[i + 1], DegreeComp(
                g)); // In outdag, sort all neighbors of i according to their degree. Note that DegreeComp gives the desired comparator.

    ret.outlist = outdag;
    ret.inlist = indag;

    return ret;
}